

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O1

void __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::parseClosingXMLElement
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this)

{
  unsigned_short uVar1;
  int iVar2;
  unsigned_short *puVar3;
  unsigned_short *c;
  string<unsigned_short> local_30;
  
  this->CurrentNodeType = EXN_ELEMENT_END;
  this->IsEmptyElement = false;
  core::array<irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::SAttribute>::clear
            (&this->Attributes);
  c = this->P + 1;
  puVar3 = c;
  do {
    this->P = puVar3;
    uVar1 = *puVar3;
    puVar3 = puVar3 + 1;
  } while (uVar1 != 0x3e);
  puVar3 = this->P;
  iVar2 = isspace((uint)puVar3[-1]);
  while (iVar2 != 0) {
    this->P = puVar3 + -1;
    iVar2 = isspace((uint)puVar3[-2]);
    puVar3 = puVar3 + -1;
  }
  core::string<unsigned_short>::string<unsigned_short>
            (&local_30,c,(s32)((ulong)((long)puVar3 - (long)c) >> 1));
  core::string<unsigned_short>::operator=(&this->NodeName,&local_30);
  if (local_30.array != (unsigned_short *)0x0) {
    operator_delete__(local_30.array);
  }
  this->P = this->P + 1;
  return;
}

Assistant:

void parseClosingXMLElement()
	{
		CurrentNodeType = EXN_ELEMENT_END;
		IsEmptyElement = false;
		Attributes.clear();

		++P;
		const char_type* pBeginClose = P;

		while(*P != L'>')
			++P;

    // remove trailing whitespace, if any
    while( std::isspace( P[-1]))
      --P;

		NodeName = core::string<char_type>(pBeginClose, (int)(P - pBeginClose));
		++P;
	}